

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_target(Curl_easy *data,connectdata *conn,dynbuf *r)

{
  long lVar1;
  char cVar2;
  int iVar3;
  CURLcode CVar4;
  CURLU *u;
  undefined8 uVar5;
  CURLU *local_70;
  char *local_60;
  char *type;
  CURLU *h;
  char *url;
  char *pcStack_40;
  CURLUcode uc;
  char *query;
  char *path;
  dynbuf *pdStack_28;
  CURLcode result;
  dynbuf *r_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  path._4_4_ = 0;
  query = (data->state).up.path;
  pcStack_40 = (data->state).up.query;
  if ((data->set).str[0x42] != (char *)0x0) {
    query = (data->set).str[0x42];
    pcStack_40 = (char *)0x0;
  }
  pdStack_28 = r;
  r_local = (dynbuf *)conn;
  conn_local = (connectdata *)data;
  if (((*(uint *)&(conn->bits).field_0x4 & 1) == 0) ||
     ((*(uint *)&(conn->bits).field_0x4 >> 3 & 1) != 0)) {
    path._4_4_ = Curl_dyn_add(r,query);
    if (path._4_4_ != CURLE_OK) {
      return path._4_4_;
    }
    CVar4 = CURLE_OK;
    if (pcStack_40 != (char *)0x0) {
      CVar4 = Curl_dyn_addf(pdStack_28,"?%s",pcStack_40);
    }
  }
  else {
    u = curl_url_dup((data->state).uh);
    if (u == (CURLU *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (r_local[5].bufr != (char *)r_local[4].toobig) {
      url._4_4_ = curl_url_set(u,CURLUPART_HOST,(char *)r_local[4].toobig,0);
      if (url._4_4_ != CURLUE_OK) {
        curl_url_cleanup(u);
        return CURLE_OUT_OF_MEMORY;
      }
      url._4_4_ = 0;
    }
    url._4_4_ = curl_url_set(u,CURLUPART_FRAGMENT,(char *)0x0,0);
    if (url._4_4_ != CURLUE_OK) {
      curl_url_cleanup(u);
      return CURLE_OUT_OF_MEMORY;
    }
    iVar3 = Curl_strcasecompare("http",conn_local[3].socks_proxy.user);
    if (iVar3 != 0) {
      url._4_4_ = curl_url_set(u,CURLUPART_USER,(char *)0x0,0);
      if (url._4_4_ != CURLUE_OK) {
        curl_url_cleanup(u);
        return CURLE_OUT_OF_MEMORY;
      }
      url._4_4_ = curl_url_set(u,CURLUPART_PASSWORD,(char *)0x0,0);
      if (url._4_4_ != CURLUE_OK) {
        curl_url_cleanup(u);
        return CURLE_OUT_OF_MEMORY;
      }
      url._4_4_ = CURLUE_OK;
    }
    url._4_4_ = curl_url_get(u,CURLUPART_URL,(char **)&h,2);
    if (url._4_4_ != CURLUE_OK) {
      curl_url_cleanup(u);
      return CURLE_OUT_OF_MEMORY;
    }
    curl_url_cleanup(u);
    lVar1._0_4_ = conn_local[1].sockfd;
    lVar1._4_4_ = conn_local[1].writesockfd;
    if (lVar1 == 0) {
      local_70 = h;
    }
    else {
      local_70 = *(CURLU **)&conn_local[1].sockfd;
    }
    path._4_4_ = Curl_dyn_add(pdStack_28,(char *)local_70);
    (*Curl_cfree)(h);
    if (path._4_4_ != CURLE_OK) {
      return path._4_4_;
    }
    iVar3 = Curl_strcasecompare("ftp",conn_local[3].socks_proxy.user);
    CVar4 = path._4_4_;
    if ((iVar3 != 0) &&
       ((*(ulong *)((long)&conn_local[1].proto.httpc.local_settings_num + 2) >> 0x24 & 1) != 0)) {
      local_60 = strstr(query,";type=");
      if (((local_60 != (char *)0x0) &&
          (((local_60[6] != '\0' && (local_60[7] == '\0')) &&
           (cVar2 = Curl_raw_toupper(local_60[6]), cVar2 != 'A')))) &&
         ((cVar2 != 'D' && (cVar2 != 'I')))) {
        local_60 = (char *)0x0;
      }
      CVar4 = path._4_4_;
      if (local_60 == (char *)0x0) {
        uVar5 = 0x69;
        if ((*(uint *)&conn_local[3].proxy_ssl[1].backend >> 0xf & 1) != 0) {
          uVar5 = 0x61;
        }
        CVar4 = Curl_dyn_addf(pdStack_28,";type=%c",uVar5);
        if (CVar4 != CURLE_OK) {
          return CVar4;
        }
      }
    }
  }
  path._4_4_ = CVar4;
  return path._4_4_;
}

Assistant:

CURLcode Curl_http_target(struct Curl_easy *data,
                          struct connectdata *conn,
                          struct dynbuf *r)
{
  CURLcode result = CURLE_OK;
  const char *path = data->state.up.path;
  const char *query = data->state.up.query;

  if(data->set.str[STRING_TARGET]) {
    path = data->set.str[STRING_TARGET];
    query = NULL;
  }

#ifndef CURL_DISABLE_PROXY
  if(conn->bits.httpproxy && !conn->bits.tunnel_proxy) {
    /* Using a proxy but does not tunnel through it */

    /* The path sent to the proxy is in fact the entire URL. But if the remote
       host is a IDN-name, we must make sure that the request we produce only
       uses the encoded host name! */

    /* and no fragment part */
    CURLUcode uc;
    char *url;
    CURLU *h = curl_url_dup(data->state.uh);
    if(!h)
      return CURLE_OUT_OF_MEMORY;

    if(conn->host.dispname != conn->host.name) {
      uc = curl_url_set(h, CURLUPART_HOST, conn->host.name, 0);
      if(uc) {
        curl_url_cleanup(h);
        return CURLE_OUT_OF_MEMORY;
      }
    }
    uc = curl_url_set(h, CURLUPART_FRAGMENT, NULL, 0);
    if(uc) {
      curl_url_cleanup(h);
      return CURLE_OUT_OF_MEMORY;
    }

    if(strcasecompare("http", data->state.up.scheme)) {
      /* when getting HTTP, we don't want the userinfo the URL */
      uc = curl_url_set(h, CURLUPART_USER, NULL, 0);
      if(uc) {
        curl_url_cleanup(h);
        return CURLE_OUT_OF_MEMORY;
      }
      uc = curl_url_set(h, CURLUPART_PASSWORD, NULL, 0);
      if(uc) {
        curl_url_cleanup(h);
        return CURLE_OUT_OF_MEMORY;
      }
    }
    /* Extract the URL to use in the request. Store in STRING_TEMP_URL for
       clean-up reasons if the function returns before the free() further
       down. */
    uc = curl_url_get(h, CURLUPART_URL, &url, CURLU_NO_DEFAULT_PORT);
    if(uc) {
      curl_url_cleanup(h);
      return CURLE_OUT_OF_MEMORY;
    }

    curl_url_cleanup(h);

    /* target or url */
    result = Curl_dyn_add(r, data->set.str[STRING_TARGET]?
      data->set.str[STRING_TARGET]:url);
    free(url);
    if(result)
      return (result);

    if(strcasecompare("ftp", data->state.up.scheme)) {
      if(data->set.proxy_transfer_mode) {
        /* when doing ftp, append ;type=<a|i> if not present */
        char *type = strstr(path, ";type=");
        if(type && type[6] && type[7] == 0) {
          switch(Curl_raw_toupper(type[6])) {
          case 'A':
          case 'D':
          case 'I':
            break;
          default:
            type = NULL;
          }
        }
        if(!type) {
          result = Curl_dyn_addf(r, ";type=%c",
                                 data->state.prefer_ascii ? 'a' : 'i');
          if(result)
            return result;
        }
      }
    }
  }

  else
#else
    (void)conn; /* not used in disabled-proxy builds */
#endif
  {
    result = Curl_dyn_add(r, path);
    if(result)
      return result;
    if(query)
      result = Curl_dyn_addf(r, "?%s", query);
  }

  return result;
}